

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O3

void worker(void *arg)

{
  long lVar1;
  undefined8 *puVar2;
  void *pvVar3;
  void **ppvVar4;
  long *plVar5;
  bool bVar6;
  
  uv_sem_post((uv_sem_t *)arg);
  uv_mutex_lock(&mutex);
LAB_00114a93:
  do {
    while (plVar5 = (long *)wq[0], (void **)wq[0] == wq) {
LAB_00114ac9:
      idle_threads = idle_threads + 1;
      uv_cond_wait(&cond,&mutex);
      idle_threads = idle_threads - 1;
    }
    bVar6 = (void **)wq[0] == run_slow_work_message;
    if ((bVar6) && ((void **)run_slow_work_message[0] == wq)) {
      bVar6 = true;
      ppvVar4 = wq;
      if (nthreads + 1 >> 1 <= slow_io_work_running) goto LAB_00114ac9;
    }
    else {
      if ((void **)wq[0] == exit_message) {
        uv_cond_signal(&cond);
        uv_mutex_unlock(&mutex);
        return;
      }
      ppvVar4 = *wq[0];
    }
    **(undefined8 **)((long)wq[0] + 8) = ppvVar4;
    *(undefined8 *)(*plVar5 + 8) = *(undefined8 *)((long)plVar5 + 8);
    *plVar5 = (long)plVar5;
    *(long **)((long)plVar5 + 8) = plVar5;
    pvVar3 = slow_io_pending_wq[0];
    if (!bVar6) {
LAB_00114bb4:
      uv_mutex_unlock(&mutex);
      (*(code *)plVar5[-3])(plVar5 + -3);
      uv_mutex_lock((uv_mutex_t *)(plVar5[-1] + 0x88));
      plVar5[-3] = 0;
      *plVar5 = plVar5[-1] + 0x78;
      puVar2 = *(undefined8 **)(plVar5[-1] + 0x80);
      plVar5[1] = (long)puVar2;
      *puVar2 = plVar5;
      *(long **)(plVar5[-1] + 0x80) = plVar5;
      uv_async_send((uv_async_t *)(plVar5[-1] + 0xb0));
      uv_mutex_unlock((uv_mutex_t *)(plVar5[-1] + 0x88));
      uv_mutex_lock(&mutex);
      if (bVar6) {
        slow_io_work_running = slow_io_work_running - 1;
      }
      goto LAB_00114a93;
    }
    if (slow_io_work_running < nthreads + 1 >> 1) {
      if ((void **)slow_io_pending_wq[0] != slow_io_pending_wq) {
        slow_io_work_running = slow_io_work_running + 1;
        lVar1 = *slow_io_pending_wq[0];
        **(long **)((long)slow_io_pending_wq[0] + 8) = lVar1;
        *(undefined8 *)(lVar1 + 8) = *(undefined8 *)((long)pvVar3 + 8);
        *(void **)pvVar3 = pvVar3;
        *(void **)((long)pvVar3 + 8) = pvVar3;
        plVar5 = (long *)pvVar3;
        if ((void **)slow_io_pending_wq[0] != slow_io_pending_wq) {
          run_slow_work_message[0] = wq;
          run_slow_work_message[1] = wq[1];
          *(void ***)wq[1] = run_slow_work_message;
          wq[1] = run_slow_work_message;
          if (idle_threads != 0) {
            uv_cond_signal(&cond);
          }
        }
        goto LAB_00114bb4;
      }
    }
    else {
      run_slow_work_message[0] = wq;
      *(void **)((long)plVar5 + 8) = wq[1];
      *(void ***)wq[1] = run_slow_work_message;
      wq[1] = run_slow_work_message;
    }
  } while( true );
}

Assistant:

static void worker(void* arg) {
  struct uv__work* w;
  QUEUE* q;
  int is_slow_work;

  uv_sem_post((uv_sem_t*) arg);
  arg = NULL;

  uv_mutex_lock(&mutex);
  for (;;) {
    /* `mutex` should always be locked at this point. */

    /* Keep waiting while either no work is present or only slow I/O
       and we're at the threshold for that. */
    while (QUEUE_EMPTY(&wq) ||
           (QUEUE_HEAD(&wq) == &run_slow_work_message &&
            QUEUE_NEXT(&run_slow_work_message) == &wq &&
            slow_io_work_running >= slow_work_thread_threshold())) {
      idle_threads += 1;
      uv_cond_wait(&cond, &mutex);
      idle_threads -= 1;
    }

    q = QUEUE_HEAD(&wq);
    if (q == &exit_message) {
      uv_cond_signal(&cond);
      uv_mutex_unlock(&mutex);
      break;
    }

    QUEUE_REMOVE(q);
    QUEUE_INIT(q);  /* Signal uv_cancel() that the work req is executing. */

    is_slow_work = 0;
    if (q == &run_slow_work_message) {
      /* If we're at the slow I/O threshold, re-schedule until after all
         other work in the queue is done. */
      if (slow_io_work_running >= slow_work_thread_threshold()) {
        QUEUE_INSERT_TAIL(&wq, q);
        continue;
      }

      /* If we encountered a request to run slow I/O work but there is none
         to run, that means it's cancelled => Start over. */
      if (QUEUE_EMPTY(&slow_io_pending_wq))
        continue;

      is_slow_work = 1;
      slow_io_work_running++;

      q = QUEUE_HEAD(&slow_io_pending_wq);
      QUEUE_REMOVE(q);
      QUEUE_INIT(q);

      /* If there is more slow I/O work, schedule it to be run as well. */
      if (!QUEUE_EMPTY(&slow_io_pending_wq)) {
        QUEUE_INSERT_TAIL(&wq, &run_slow_work_message);
        if (idle_threads > 0)
          uv_cond_signal(&cond);
      }
    }

    uv_mutex_unlock(&mutex);

    w = QUEUE_DATA(q, struct uv__work, wq);
    w->work(w);

    uv_mutex_lock(&w->loop->wq_mutex);
    w->work = NULL;  /* Signal uv_cancel() that the work req is done
                        executing. */
    QUEUE_INSERT_TAIL(&w->loop->wq, &w->wq);
    uv_async_send(&w->loop->wq_async);
    uv_mutex_unlock(&w->loop->wq_mutex);

    /* Lock `mutex` since that is expected at the start of the next
     * iteration. */
    uv_mutex_lock(&mutex);
    if (is_slow_work) {
      /* `slow_io_work_running` is protected by `mutex`. */
      slow_io_work_running--;
    }
  }
}